

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O2

void google::protobuf::Field::MergeImpl(MessageLite *to_msg,MessageLite *from_msg)

{
  uint uVar1;
  int iVar2;
  Field *pFVar3;
  Nullable<const_char_*> failure_msg;
  Arena *pAVar4;
  string *psVar5;
  Field *_this;
  allocator<char> local_41;
  Field *local_40;
  string local_38;
  
  local_40 = (Field *)to_msg;
  local_38._M_dataplus._M_p = (pointer)from_msg;
  failure_msg = absl::lts_20250127::log_internal::
                Check_NEImpl<google::protobuf::Field_const*,google::protobuf::Field*>
                          ((Field **)&local_38,&local_40,"&from != _this");
  if (failure_msg != (Nullable<const_char_*>)0x0) {
    absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_38,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/type.pb.cc"
               ,0x567,failure_msg);
    absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
              ((LogMessageFatal *)&local_38);
  }
  RepeatedPtrField<google::protobuf::Option>::MergeFrom
            (&(local_40->field_0)._impl_.options_,
             (RepeatedPtrField<google::protobuf::Option> *)&from_msg[1]._internal_metadata_);
  pFVar3 = local_40;
  uVar1 = *(uint *)&from_msg[1]._vptr_MessageLite;
  if ((char)uVar1 != '\0') {
    if ((uVar1 & 1) != 0) {
      psVar5 = (string *)((ulong)from_msg[3]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar5->_M_string_length == 0) {
        if (((ulong)(local_40->field_0)._impl_.name_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 1;
          pAVar4 = (Arena *)(pFVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar4 & 1) != 0) {
            pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>(&(pFVar3->field_0)._impl_.name_,&local_38,pAVar4);
          std::__cxx11::string::~string((string *)&local_38);
        }
      }
      else {
        *(byte *)&local_40->field_0 = *(byte *)&local_40->field_0 | 1;
        pAVar4 = (Arena *)(local_40->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(local_40->field_0)._impl_.name_,psVar5,pAVar4);
      }
    }
    pFVar3 = local_40;
    if ((uVar1 & 2) != 0) {
      psVar5 = (string *)(from_msg[3]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (psVar5->_M_string_length == 0) {
        if (((ulong)(local_40->field_0)._impl_.type_url_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 2;
          pAVar4 = (Arena *)(pFVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar4 & 1) != 0) {
            pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>(&(pFVar3->field_0)._impl_.type_url_,&local_38,pAVar4);
          std::__cxx11::string::~string((string *)&local_38);
        }
      }
      else {
        *(byte *)&local_40->field_0 = *(byte *)&local_40->field_0 | 2;
        pAVar4 = (Arena *)(local_40->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(local_40->field_0)._impl_.type_url_,psVar5,pAVar4);
      }
    }
    pFVar3 = local_40;
    if ((uVar1 & 4) != 0) {
      psVar5 = (string *)((ulong)from_msg[4]._vptr_MessageLite & 0xfffffffffffffffc);
      if (psVar5->_M_string_length == 0) {
        if (((ulong)(local_40->field_0)._impl_.json_name_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 4;
          pAVar4 = (Arena *)(pFVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar4 & 1) != 0) {
            pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>(&(pFVar3->field_0)._impl_.json_name_,&local_38,pAVar4);
          std::__cxx11::string::~string((string *)&local_38);
        }
      }
      else {
        *(byte *)&local_40->field_0 = *(byte *)&local_40->field_0 | 4;
        pAVar4 = (Arena *)(local_40->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(local_40->field_0)._impl_.json_name_,psVar5,pAVar4);
      }
    }
    pFVar3 = local_40;
    if ((uVar1 & 8) != 0) {
      psVar5 = (string *)(from_msg[4]._internal_metadata_.ptr_ & 0xfffffffffffffffc);
      if (psVar5->_M_string_length == 0) {
        if (((ulong)(local_40->field_0)._impl_.default_value_.tagged_ptr_.ptr_ & 3) == 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_38,anon_var_dwarf_651463 + 5,&local_41);
          *(byte *)&pFVar3->field_0 = *(byte *)&pFVar3->field_0 | 8;
          pAVar4 = (Arena *)(pFVar3->super_Message).super_MessageLite._internal_metadata_.ptr_;
          if (((ulong)pAVar4 & 1) != 0) {
            pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
          }
          internal::ArenaStringPtr::Set<>(&(pFVar3->field_0)._impl_.default_value_,&local_38,pAVar4)
          ;
          std::__cxx11::string::~string((string *)&local_38);
        }
      }
      else {
        *(byte *)&local_40->field_0 = *(byte *)&local_40->field_0 | 8;
        pAVar4 = (Arena *)(local_40->super_Message).super_MessageLite._internal_metadata_.ptr_;
        if (((ulong)pAVar4 & 1) != 0) {
          pAVar4 = *(Arena **)((ulong)pAVar4 & 0xfffffffffffffffe);
        }
        internal::ArenaStringPtr::Set<>(&(local_40->field_0)._impl_.default_value_,psVar5,pAVar4);
      }
    }
    if (((uVar1 & 0x10) != 0) && (*(int *)&from_msg[5]._vptr_MessageLite != 0)) {
      *(int *)((long)&local_40->field_0 + 0x40) = *(int *)&from_msg[5]._vptr_MessageLite;
    }
    if (((uVar1 & 0x20) != 0) &&
       (iVar2 = *(int *)((long)&from_msg[5]._vptr_MessageLite + 4), iVar2 != 0)) {
      (local_40->field_0)._impl_.cardinality_ = iVar2;
    }
    if (((uVar1 & 0x40) != 0) && (iVar2 = (int)from_msg[5]._internal_metadata_.ptr_, iVar2 != 0)) {
      *(int *)((long)&local_40->field_0 + 0x48) = iVar2;
    }
    if (((char)uVar1 < '\0') &&
       (iVar2 = *(int *)((long)&from_msg[5]._internal_metadata_.ptr_ + 4), iVar2 != 0)) {
      (local_40->field_0)._impl_.oneof_index_ = iVar2;
    }
  }
  if (((uVar1 >> 8 & 1) != 0) && (*(char *)&from_msg[6]._vptr_MessageLite == '\x01')) {
    *(undefined1 *)((long)&local_40->field_0 + 0x50) = 1;
  }
  (local_40->field_0)._impl_._has_bits_.has_bits_[0] =
       (local_40->field_0)._impl_._has_bits_.has_bits_[0] | uVar1;
  internal::InternalMetadata::MergeFrom<google::protobuf::UnknownFieldSet>
            (&(local_40->super_Message).super_MessageLite._internal_metadata_,
             &from_msg->_internal_metadata_);
  return;
}

Assistant:

void Field::MergeImpl(::google::protobuf::MessageLite& to_msg, const ::google::protobuf::MessageLite& from_msg) {
  auto* const _this = static_cast<Field*>(&to_msg);
  auto& from = static_cast<const Field&>(from_msg);
  // @@protoc_insertion_point(class_specific_merge_from_start:google.protobuf.Field)
  ABSL_DCHECK_NE(&from, _this);
  ::uint32_t cached_has_bits = 0;
  (void) cached_has_bits;

  _this->_internal_mutable_options()->MergeFrom(
      from._internal_options());
  cached_has_bits = from._impl_._has_bits_[0];
  if ((cached_has_bits & 0x000000ffu) != 0) {
    if ((cached_has_bits & 0x00000001u) != 0) {
      if (!from._internal_name().empty()) {
        _this->_internal_set_name(from._internal_name());
      } else {
        if (_this->_impl_.name_.IsDefault()) {
          _this->_internal_set_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000002u) != 0) {
      if (!from._internal_type_url().empty()) {
        _this->_internal_set_type_url(from._internal_type_url());
      } else {
        if (_this->_impl_.type_url_.IsDefault()) {
          _this->_internal_set_type_url("");
        }
      }
    }
    if ((cached_has_bits & 0x00000004u) != 0) {
      if (!from._internal_json_name().empty()) {
        _this->_internal_set_json_name(from._internal_json_name());
      } else {
        if (_this->_impl_.json_name_.IsDefault()) {
          _this->_internal_set_json_name("");
        }
      }
    }
    if ((cached_has_bits & 0x00000008u) != 0) {
      if (!from._internal_default_value().empty()) {
        _this->_internal_set_default_value(from._internal_default_value());
      } else {
        if (_this->_impl_.default_value_.IsDefault()) {
          _this->_internal_set_default_value("");
        }
      }
    }
    if ((cached_has_bits & 0x00000010u) != 0) {
      if (from._internal_kind() != 0) {
        _this->_impl_.kind_ = from._impl_.kind_;
      }
    }
    if ((cached_has_bits & 0x00000020u) != 0) {
      if (from._internal_cardinality() != 0) {
        _this->_impl_.cardinality_ = from._impl_.cardinality_;
      }
    }
    if ((cached_has_bits & 0x00000040u) != 0) {
      if (from._internal_number() != 0) {
        _this->_impl_.number_ = from._impl_.number_;
      }
    }
    if ((cached_has_bits & 0x00000080u) != 0) {
      if (from._internal_oneof_index() != 0) {
        _this->_impl_.oneof_index_ = from._impl_.oneof_index_;
      }
    }
  }
  if ((cached_has_bits & 0x00000100u) != 0) {
    if (from._internal_packed() != 0) {
      _this->_impl_.packed_ = from._impl_.packed_;
    }
  }
  _this->_impl_._has_bits_[0] |= cached_has_bits;
  _this->_internal_metadata_.MergeFrom<::google::protobuf::UnknownFieldSet>(from._internal_metadata_);
}